

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp_history.cpp
# Opt level: O3

uint32_t __thiscall
libtorrent::aux::timestamp_history::add_sample(timestamp_history *this,uint32_t sample,bool step)

{
  uint *puVar1;
  uint32_t uVar2;
  bool bVar3;
  uint16_t uVar4;
  uint uVar5;
  long lVar6;
  array<unsigned_int,_20UL> *__range3;
  
  uVar4 = this->m_num_samples;
  if (uVar4 != 0xfffe) {
    if (uVar4 == 0xffff) {
      lVar6 = 0;
      do {
        puVar1 = (this->m_history)._M_elems + lVar6;
        *puVar1 = sample;
        puVar1[1] = sample;
        puVar1[2] = sample;
        puVar1[3] = sample;
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x14);
      this->m_base = sample;
      uVar4 = 0;
    }
    this->m_num_samples = uVar4 + 1;
  }
  bVar3 = compare_less_wrap(sample,this->m_base,0xffffffff);
  if (bVar3) {
    this->m_base = sample;
  }
  else {
    bVar3 = compare_less_wrap(sample,(this->m_history)._M_elems[this->m_index],0xffffffff);
    if (!bVar3) goto LAB_00308cb5;
  }
  (this->m_history)._M_elems[this->m_index] = sample;
LAB_00308cb5:
  uVar2 = this->m_base;
  if ((step) && (0x78 < this->m_num_samples)) {
    this->m_num_samples = 0;
    uVar5 = (uint)this->m_index + ((this->m_index + 1) / 0x14) * -0x14 + 1;
    this->m_index = (uint16_t)uVar5;
    (this->m_history)._M_elems[uVar5] = sample;
    this->m_base = sample;
    lVar6 = 0;
    do {
      bVar3 = compare_less_wrap(*(uint32_t *)((long)(this->m_history)._M_elems + lVar6),this->m_base
                                ,0xffffffff);
      if (bVar3) {
        this->m_base = *(uint32_t *)((long)(this->m_history)._M_elems + lVar6);
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x50);
  }
  return sample - uVar2;
}

Assistant:

std::uint32_t timestamp_history::add_sample(std::uint32_t sample, bool step)
{
	if (!initialized())
	{
		m_history.fill(sample);
		m_base = sample;
		m_num_samples = 0;
	}

	// don't let the counter wrap
	if (m_num_samples < 0xfffe) ++m_num_samples;

	// if sample is less than base, update the base
	// and update the history entry (because it will
	// be less than that too)
	if (compare_less_wrap(sample, m_base, TIME_MASK))
	{
		m_base = sample;
		m_history[m_index] = sample;
	}
	// if sample is less than our history entry, update it
	else if (compare_less_wrap(sample, m_history[m_index], TIME_MASK))
	{
		m_history[m_index] = sample;
	}

	std::uint32_t ret = sample - m_base;

	// don't step base delay history unless we have at least 120
	// samples. Anything less would suggest that the connection is
	// essentially idle and the samples are probably not very reliable
	if (step && m_num_samples > 120)
	{
		m_num_samples = 0;
		m_index = (m_index + 1) % history_size;

		m_history[m_index] = sample;
		// update m_base
		m_base = sample;
		for (auto& h : m_history)
		{
			if (compare_less_wrap(h, m_base, TIME_MASK))
				m_base = h;
		}
	}
	return ret;
}